

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  int iVar1;
  char *__src;
  long *in_RDI;
  char *s;
  size_t vl;
  lua_State *L;
  luaL_Buffer *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  luaL_Buffer *B_00;
  
  B_00 = (luaL_Buffer *)in_RDI[2];
  __src = lua_tolstring(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                        (size_t *)in_stack_ffffffffffffffd8);
  if ((lua_State *)(0x2000U - (*in_RDI - (long)(in_RDI + 3))) < in_stack_ffffffffffffffe8) {
    iVar1 = emptybuffer(in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      lua_insert((lua_State *)vl,s._4_4_);
    }
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
    adjuststack(B_00);
  }
  else {
    memcpy((void *)*in_RDI,__src,(size_t)in_stack_ffffffffffffffe8);
    *in_RDI = (long)&in_stack_ffffffffffffffe8->next + *in_RDI;
    lua_settop((lua_State *)B_00,-2);
  }
  return;
}

Assistant:

static void luaL_addvalue(luaL_Buffer*B){
lua_State*L=B->L;
size_t vl;
const char*s=lua_tolstring(L,-1,&vl);
if(vl<=bufffree(B)){
memcpy(B->p,s,vl);
B->p+=vl;
lua_pop(L,1);
}
else{
if(emptybuffer(B))
lua_insert(L,-2);
B->lvl++;
adjuststack(B);
}
}